

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

int Pdr_SetIsInit(Pdr_Set_t *pCube,int iRemove)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < (long)pCube->nLits) {
    uVar2 = 0;
    do {
      uVar1 = *(uint *)(&pCube->field_0x14 + uVar2 * 4);
      if (uVar1 == 0xffffffff) {
        __assert_fail("pCube->Lits[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                      ,0x1d1,"int Pdr_SetIsInit(Pdr_Set_t *, int)");
      }
      if ((uint)iRemove != uVar2) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar1 & 1) == 0) {
          return 0;
        }
      }
      uVar2 = uVar2 + 1;
    } while ((long)pCube->nLits != uVar2);
  }
  return 1;
}

Assistant:

int Pdr_SetIsInit( Pdr_Set_t * pCube, int iRemove )
{
    int i;
    for ( i = 0; i < pCube->nLits; i++ )
    {
        assert( pCube->Lits[i] != -1 );
        if ( i == iRemove )
            continue;
        if ( Abc_LitIsCompl( pCube->Lits[i] ) == 0 )
            return 0;
    }
    return 1;
}